

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_DNS(RTPUDPv6Transmitter *this)

{
  int iVar1;
  sockaddr_in6 *addr;
  addrinfo *tmp;
  addrinfo *res;
  addrinfo hints;
  char name [1024];
  int status;
  RTPUDPv6Transmitter *this_local;
  
  gethostname((char *)&hints.ai_next,0x3ff);
  memset(&res,0,0x30);
  res._4_4_ = 10;
  hints.ai_flags = 0;
  hints.ai_family = 0;
  iVar1 = getaddrinfo((char *)&hints.ai_next,(char *)0x0,(addrinfo *)&res,(addrinfo **)&tmp);
  if (iVar1 == 0) {
    for (addr = (sockaddr_in6 *)tmp; addr != (sockaddr_in6 *)0x0;
        addr = *(sockaddr_in6 **)((long)&addr[1].sin6_addr.__in6_u + 4)) {
      if (addr->sin6_flowinfo == 10) {
        std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
                  (&this->localIPs,(value_type *)(*(long *)&addr->sin6_scope_id + 8));
      }
    }
    freeaddrinfo((addrinfo *)tmp);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::GetLocalIPList_DNS()
{
	int status;
	char name[1024];

	gethostname(name,1023);
	name[1023] = 0;

	struct addrinfo hints;
	struct addrinfo *res,*tmp;
	
	memset(&hints,0,sizeof(struct addrinfo));
	hints.ai_family = AF_INET6;
	hints.ai_socktype = 0;
	hints.ai_protocol = 0;

	if ((status = getaddrinfo(name,0,&hints,&res)) != 0)
		return;

	tmp = res;
	while (tmp != 0)
	{
		if (tmp->ai_family == AF_INET6)
		{
			struct sockaddr_in6 *addr = (struct sockaddr_in6 *)(tmp->ai_addr);
			localIPs.push_back(addr->sin6_addr);
		}
		tmp = tmp->ai_next;
	}
	
	freeaddrinfo(res);	
}